

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_drawt_pal.cpp
# Opt level: O0

void __thiscall
swrenderer::DrawColumnRt4AddPalCommand::Execute
          (DrawColumnRt4AddPalCommand *this,DrawerThread *thread)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  uint8_t *puVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  uint32_t bg;
  uint32_t fg;
  uint32_t *bg2rgb;
  uint32_t *fg2rgb;
  int count;
  int pitch;
  uint8_t *dest;
  uint8_t *source;
  uint8_t *colormap;
  DrawerThread *thread_local;
  DrawColumnRt4AddPalCommand *this_local;
  
  fg2rgb._0_4_ = DrawerThread::count_for_thread
                           (thread,(this->super_PalRtCommand).yl,
                            ((this->super_PalRtCommand).yh - (this->super_PalRtCommand).yl) + 1);
  if (0 < (int)fg2rgb) {
    puVar1 = (this->super_PalRtCommand)._srcblend;
    puVar2 = (this->super_PalRtCommand)._destblend;
    iVar5 = (this->super_PalRtCommand).yl;
    iVar4 = DrawerThread::skipped_by_thread(thread,(this->super_PalRtCommand).yl);
    _count = (this->super_PalRtCommand)._destorg +
             (*(int *)(ylookup + (long)(iVar5 + iVar4) * 4) + (this->super_PalRtCommand).sx);
    puVar3 = thread->dc_temp;
    iVar5 = DrawerThread::temp_line_for_thread(thread,(this->super_PalRtCommand).yl);
    dest = puVar3 + (iVar5 << 2);
    iVar5 = (this->super_PalRtCommand)._pitch;
    iVar4 = thread->num_cores;
    puVar3 = (this->super_PalRtCommand)._colormap;
    do {
      uVar6 = puVar1[puVar3[*dest]] + puVar2[*_count] | 0x1f07c1f;
      *_count = RGB32k.All[uVar6 & uVar6 >> 0xf];
      uVar6 = puVar1[puVar3[dest[1]]] + puVar2[_count[1]] | 0x1f07c1f;
      _count[1] = RGB32k.All[uVar6 & uVar6 >> 0xf];
      uVar6 = puVar1[puVar3[dest[2]]] + puVar2[_count[2]] | 0x1f07c1f;
      _count[2] = RGB32k.All[uVar6 & uVar6 >> 0xf];
      uVar6 = puVar1[puVar3[dest[3]]] + puVar2[_count[3]] | 0x1f07c1f;
      _count[3] = RGB32k.All[uVar6 & uVar6 >> 0xf];
      dest = dest + 4;
      _count = _count + iVar5 * iVar4;
      fg2rgb._0_4_ = (int)fg2rgb + -1;
    } while ((int)fg2rgb != 0);
  }
  return;
}

Assistant:

void DrawColumnRt4AddPalCommand::Execute(DrawerThread *thread)
	{
		const uint8_t *colormap;
		uint8_t *source;
		uint8_t *dest;
		int pitch;

		int count = yh - yl + 1;
		count = thread->count_for_thread(yl, count);
		if (count <= 0)
			return;

		const uint32_t *fg2rgb = _srcblend;
		const uint32_t *bg2rgb = _destblend;
		dest = ylookup[yl + thread->skipped_by_thread(yl)] + sx + _destorg;
		source = &thread->dc_temp[thread->temp_line_for_thread(yl)*4];
		pitch = _pitch * thread->num_cores;
		colormap = _colormap;

		do {
			uint32_t fg = colormap[source[0]];
			uint32_t bg = dest[0];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[0] = RGB32k.All[fg & (fg>>15)];

			fg = colormap[source[1]];
			bg = dest[1];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[1] = RGB32k.All[fg & (fg>>15)];


			fg = colormap[source[2]];
			bg = dest[2];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[2] = RGB32k.All[fg & (fg>>15)];

			fg = colormap[source[3]];
			bg = dest[3];
			fg = fg2rgb[fg];
			bg = bg2rgb[bg];
			fg = (fg+bg) | 0x1f07c1f;
			dest[3] = RGB32k.All[fg & (fg>>15)];

			source += 4;
			dest += pitch;
		} while (--count);
	}